

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptFunctionType.cpp
# Opt level: O2

ScriptFunctionType *
Js::ScriptFunctionType::New
          (FunctionProxy *proxy,DynamicTypeHandler *typeHandler,RecyclableObject *prototype,
          bool isShared)

{
  JavascriptMethod entryPoint;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ScriptContext *scriptContext;
  Recycler *alloc;
  ScriptFunctionType *this;
  ProxyEntryPointInfo *pPVar4;
  undefined1 local_68 [8];
  TrackAllocData data;
  
  data._32_8_ = typeHandler;
  if ((((proxy->functionInfo).ptr)->functionBodyImpl).ptr != proxy) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/ScriptFunctionType.cpp"
                                ,0x22,"(proxy->GetFunctionInfo()->GetFunctionProxy() == proxy)",
                                "proxy->GetFunctionInfo()->GetFunctionProxy() == proxy");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  scriptContext = FunctionProxy::GetScriptContext(proxy);
  local_68 = (undefined1  [8])&typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_9c4be52;
  data.filename._0_4_ = 0x2c;
  alloc = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_68);
  this = (ScriptFunctionType *)new<Memory::Recycler>(0x40,alloc,0x37a1d4);
  pPVar4 = FunctionProxy::GetDefaultEntryPointInfo(proxy);
  entryPoint = (JavascriptMethod)pPVar4->jsMethod;
  pPVar4 = FunctionProxy::GetDefaultEntryPointInfo(proxy);
  ScriptFunctionType(this,scriptContext,prototype,entryPoint,pPVar4,
                     (DynamicTypeHandler *)data._32_8_,isShared,isShared);
  return this;
}

Assistant:

ScriptFunctionType * ScriptFunctionType::New(FunctionProxy * proxy, DynamicTypeHandler * typeHandler, RecyclableObject * prototype, bool isShared)
    {
        Assert(proxy->GetFunctionInfo()->GetFunctionProxy() == proxy);
        ScriptContext * scriptContext = proxy->GetScriptContext();

        return RecyclerNew(scriptContext->GetRecycler(), ScriptFunctionType,
            scriptContext, 
            prototype,
            proxy->GetDefaultEntryPointInfo()->jsMethod,
            proxy->GetDefaultEntryPointInfo(),
            typeHandler,
            isShared, 
            isShared);
    }